

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIL.pb.cc
# Opt level: O2

uint8_t * __thiscall
CoreML::Specification::MILSpec::TensorValue::_InternalSerialize
          (TensorValue *this,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint8_t *puVar1;
  uint32_t uVar2;
  ulong uVar3;
  
  uVar2 = this->_oneof_case_[0];
  if (uVar2 == 1) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedFloats>
                       (1,(this->value_).floats_,puVar1,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 2) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedInts>
                       (2,(this->value_).ints_,puVar1,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 3) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedBools>
                       (3,(this->value_).bools_,puVar1,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 4) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedStrings>
                       (4,(this->value_).strings_,puVar1,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 5) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedLongInts>
                       (5,(this->value_).longints_,puVar1,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 6) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedDoubles>
                       (6,(this->value_).doubles_,puVar1,stream);
    uVar2 = this->_oneof_case_[0];
  }
  if (uVar2 == 7) {
    puVar1 = google::protobuf::io::EpsCopyOutputStream::EnsureSpace(stream,target);
    target = google::protobuf::internal::WireFormatLite::
             InternalWriteMessage<CoreML::Specification::MILSpec::TensorValue_RepeatedBytes>
                       (7,(this->value_).bytes_,puVar1,stream);
  }
  uVar3 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar3 & 1) == 0) {
    return target;
  }
  uVar3 = uVar3 & 0xfffffffffffffffc;
  puVar1 = google::protobuf::io::EpsCopyOutputStream::WriteRaw
                     (stream,*(void **)(uVar3 + 8),*(int *)(uVar3 + 0x10),target);
  return puVar1;
}

Assistant:

uint8_t* TensorValue::_InternalSerialize(
    uint8_t* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:CoreML.Specification.MILSpec.TensorValue)
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedFloats floats = 1;
  if (_internal_has_floats()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        1, _Internal::floats(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedInts ints = 2;
  if (_internal_has_ints()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        2, _Internal::ints(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedBools bools = 3;
  if (_internal_has_bools()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        3, _Internal::bools(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedStrings strings = 4;
  if (_internal_has_strings()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        4, _Internal::strings(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedLongInts longInts = 5;
  if (_internal_has_longints()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        5, _Internal::longints(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedDoubles doubles = 6;
  if (_internal_has_doubles()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        6, _Internal::doubles(this), target, stream);
  }

  // .CoreML.Specification.MILSpec.TensorValue.RepeatedBytes bytes = 7;
  if (_internal_has_bytes()) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(
        7, _Internal::bytes(this), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = stream->WriteRaw(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).data(),
        static_cast<int>(_internal_metadata_.unknown_fields<std::string>(::PROTOBUF_NAMESPACE_ID::internal::GetEmptyString).size()), target);
  }
  // @@protoc_insertion_point(serialize_to_array_end:CoreML.Specification.MILSpec.TensorValue)
  return target;
}